

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void interleave_data(float *in,float *out,int frames,int channels)

{
  ulong uVar1;
  ulong uVar2;
  float *pfVar3;
  
  if (0 < frames) {
    uVar2 = 0;
    do {
      if (0 < channels) {
        uVar1 = 0;
        pfVar3 = in;
        do {
          out[uVar1] = *pfVar3;
          uVar1 = uVar1 + 1;
          pfVar3 = pfVar3 + (uint)frames;
        } while ((uint)channels != uVar1);
      }
      uVar2 = uVar2 + 1;
      out = out + (uint)channels;
      in = in + 1;
    } while (uVar2 != (uint)frames);
  }
  return;
}

Assistant:

void
interleave_data (const float *in, float *out, int frames, int channels)
{	int fr, ch ;

	for (fr = 0 ; fr < frames ; fr++)
		for (ch = 0 ; ch < channels ; ch++)
			out [ch + channels * fr] = in [fr + frames * ch] ;

	return ;
}